

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O0

void * raviX_calloc(size_t nmemb,size_t size)

{
  void *pvVar1;
  void *ptr;
  size_t size_local;
  size_t nmemb_local;
  
  pvVar1 = calloc(nmemb,size);
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"out of memory\n");
    exit(1);
  }
  return pvVar1;
}

Assistant:

void *raviX_calloc(size_t nmemb, size_t size)
{
	void *ptr;
	ptr = calloc(nmemb, size);
        if (!ptr) {
                fprintf(stderr, "out of memory\n");
                exit(1);
        }
	return ptr;
}